

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app_hash.c
# Opt level: O0

void usage(char *arg)

{
  char *pcVar1;
  char *command;
  char *arg_local;
  
  pcVar1 = __xpg_basename(arg);
  printf("Usage: %s -p <PASSWORD> [-a <ALGORITHM>] [-s <SALT>] [-c <COST>]\n\n",pcVar1);
  printf("  -p, --password=PASSWORD   users\'s password\n");
  printf("  -a, --algorithm=ALGORITHM hashing algorithm (no used) [DEFAULT: %s]\n","bcrypt");
  printf("  -s, --salt=SALT           salt to use when hashing the password\n");
  printf("  -c, --cost=COST           cost that should be used [DEFAULT: %d]\n",10);
  printf("  -V, --version             print version\n");
  return;
}

Assistant:

static void
usage (char *arg)
{
    char *command = basename(arg);

    printf("Usage: %s -p <PASSWORD>"
           " [-a <ALGORITHM>] [-s <SALT>] [-c <COST>]\n\n", command);
    printf("  -p, --password=PASSWORD   users's password\n");
    printf("  -a, --algorithm=ALGORITHM"
           " hashing algorithm (no used) [DEFAULT: %s]\n",
           BCRYPT_BLOWFISH);
    printf("  -s, --salt=SALT          "
           " salt to use when hashing the password\n");
    printf("  -c, --cost=COST          "
           " cost that should be used [DEFAULT: %d]\n",
           BCRYPT_BLOWFISH_COST);
    printf("  -V, --version             print version\n");
}